

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_node_implicit(V *values,int num_keys,int data_capacity,StatAccumulator *acc,
                        LinearModel<int> *model)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  V *pVVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 in_XMM2_Qb;
  ulong local_58;
  
  if (0 < num_keys) {
    uVar9 = data_capacity - 1;
    uVar8 = 0xffffffff;
    uVar5 = 0;
    pVVar11 = values;
    local_58 = (ulong)(uint)num_keys;
    iVar7 = num_keys;
    do {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = model->a_;
      auVar14._0_8_ = (double)values[uVar5].first;
      auVar14._8_8_ = in_XMM2_Qb;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = model->b_;
      auVar1 = vfmadd213sd_fma(auVar14,auVar12,auVar1);
      uVar6 = (int)auVar1._0_8_;
      if ((int)uVar9 < (int)auVar1._0_8_) {
        uVar6 = uVar9;
      }
      uVar6 = ~((int)uVar6 >> 0x1f) & uVar6;
      uVar3 = uVar8 + 1;
      if ((int)(uVar8 + 1) < (int)uVar6) {
        uVar3 = uVar6;
      }
      if ((int)(data_capacity - uVar3) < iVar7) {
        uVar10 = 0;
        do {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = model->a_;
          auVar15._0_8_ = (double)pVVar11[uVar10].first;
          auVar15._8_8_ = in_XMM2_Qb;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = model->b_;
          auVar1 = vfmadd213sd_fma(auVar15,auVar13,auVar2);
          uVar6 = uVar9;
          if ((int)auVar1._0_8_ <= (int)uVar9) {
            uVar6 = (int)auVar1._0_8_;
          }
          (*acc->_vptr_StatAccumulator[2])
                    (acc,(ulong)(uint)((data_capacity - iVar7) + (int)uVar10),
                     (ulong)(~((int)uVar6 >> 0x1f) & uVar6));
          uVar10 = uVar10 + 1;
          iVar4 = iVar7;
        } while (local_58 != uVar10);
      }
      else {
        (*acc->_vptr_StatAccumulator[2])(acc,(ulong)uVar3);
        iVar4 = iVar7 + -1;
        uVar8 = uVar3;
      }
      if ((int)(data_capacity - uVar3) < iVar7) {
        return;
      }
      uVar5 = uVar5 + 1;
      pVVar11 = pVVar11 + 1;
      local_58 = local_58 - 1;
      iVar7 = iVar4;
    } while (uVar5 != (uint)num_keys);
  }
  return;
}

Assistant:

static void build_node_implicit(const V* values, int num_keys,
                                  int data_capacity, StatAccumulator* acc,
                                  const LinearModel<T>* model) {
    int last_position = -1;
    int keys_remaining = num_keys;
    for (int i = 0; i < num_keys; i++) {
      int predicted_position = std::max(
          0, std::min(data_capacity - 1, model->predict(values[i].first)));
      int actual_position =
          std::max<int>(predicted_position, last_position + 1);
      int positions_remaining = data_capacity - actual_position;
      if (positions_remaining < keys_remaining) {
        actual_position = data_capacity - keys_remaining;
        for (int j = i; j < num_keys; j++) {
          predicted_position = std::max(
              0, std::min(data_capacity - 1, model->predict(values[j].first)));
          acc->accumulate(actual_position, predicted_position);
          actual_position++;
        }
        break;
      }
      acc->accumulate(actual_position, predicted_position);
      last_position = actual_position;
      keys_remaining--;
    }
  }